

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::Logger::notify_out(Logger *this,string *message)

{
  bool bVar1;
  reference rhs;
  LoggerClient *pLVar2;
  bool local_b1;
  SmartPointer<GEO::LoggerClient> local_a8;
  SmartPointer<GEO::LoggerClient> it;
  iterator __end2;
  iterator __begin2;
  LoggerClients *__range2;
  CmdLine local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [8];
  string feat_msg;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  string *local_18;
  string *message_local;
  Logger *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  if ((this->log_everything_ & 1U) != 0) {
    local_20._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->log_features_exclude_,&this->current_feature_);
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->log_features_exclude_);
    bVar1 = std::operator==(&local_20,&local_28);
    local_b1 = true;
    if (bVar1) goto LAB_001b4656;
  }
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->log_features_,&this->current_feature_);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->log_features_);
  local_b1 = std::operator!=(&local_30,&local_38);
LAB_001b4656:
  if (local_b1 != false) {
    CmdLine::ui_feature(local_78,&this->current_feature_,(bool)(this->current_feature_changed_ & 1))
    ;
    std::operator+(local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78);
    std::__cxx11::string::~string((string *)local_78);
    __end2 = std::
             set<GEO::SmartPointer<GEO::LoggerClient>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
             ::begin(&this->clients_);
    it.pointer_ = (LoggerClient *)
                  std::
                  set<GEO::SmartPointer<GEO::LoggerClient>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
                  ::end(&this->clients_);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&it), bVar1) {
      rhs = std::_Rb_tree_const_iterator<GEO::SmartPointer<GEO::LoggerClient>_>::operator*(&__end2);
      SmartPointer<GEO::LoggerClient>::SmartPointer(&local_a8,rhs);
      pLVar2 = SmartPointer<GEO::LoggerClient>::operator->(&local_a8);
      (*(pLVar2->super_Counted)._vptr_Counted[3])(pLVar2,local_58);
      SmartPointer<GEO::LoggerClient>::~SmartPointer(&local_a8);
      std::_Rb_tree_const_iterator<GEO::SmartPointer<GEO::LoggerClient>_>::operator++(&__end2);
    }
    this->current_feature_changed_ = false;
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void Logger::notify_out(const std::string& message) {
        if(
            (log_everything_ &&
                log_features_exclude_.find(current_feature_) ==
                log_features_exclude_.end())
            || (log_features_.find(current_feature_) != log_features_.end())
        ) {
            std::string feat_msg =
                CmdLine::ui_feature(current_feature_, current_feature_changed_)
                + message;

	    for(auto it : clients_) {
                it->out(feat_msg);
            }

            current_feature_changed_ = false;
        }
    }